

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArchiveProxy.cpp
# Opt level: O1

bool __thiscall
aeron::archive::ArchiveProxy::extendRecording
          (ArchiveProxy *this,string *channel,int32_t streamId,Value sourceLocation,
          int64_t recordingId,int64_t correlationId,int64_t controlSessionId)

{
  bool bVar1;
  ExtendRecordingRequest *this_00;
  uint8_t val_3;
  int64_t val;
  int64_t val_1;
  int32_t val_2;
  ExtendRecordingRequest msg;
  ExtendRecordingRequest local_68;
  
  local_68.m_offset = 0;
  local_68.m_buffer = (char *)0x0;
  local_68.m_bufferLength = 0;
  this_00 = wrapAndApplyHeader<io::aeron::archive::codecs::ExtendRecordingRequest>(this,&local_68);
  *(int64_t *)(this_00->m_buffer + this_00->m_offset) = controlSessionId;
  *(int64_t *)(this_00->m_buffer + this_00->m_offset + 8) = correlationId;
  *(int64_t *)(this_00->m_buffer + this_00->m_offset + 0x10) = recordingId;
  *(int32_t *)(this_00->m_buffer + this_00->m_offset + 0x18) = streamId;
  this_00->m_buffer[this_00->m_offset + 0x1c] = (char)sourceLocation;
  io::aeron::archive::codecs::ExtendRecordingRequest::putChannel(this_00,channel);
  bVar1 = offer(this,(int)local_68.m_position - (int)local_68.m_offset);
  return bVar1;
}

Assistant:

bool ArchiveProxy::extendRecording(const std::string& channel, std::int32_t streamId,
                                   codecs::SourceLocation::Value sourceLocation, std::int64_t recordingId,
                                   std::int64_t correlationId, std::int64_t controlSessionId) {
    codecs::ExtendRecordingRequest msg;

    wrapAndApplyHeader(msg)
        .controlSessionId(controlSessionId)
        .correlationId(correlationId)
        .recordingId(recordingId)
        .streamId(streamId)
        .sourceLocation(sourceLocation)
        .putChannel(channel);

    return offer(msg.encodedLength());
}